

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFIter.cpp
# Opt level: O0

Box * __thiscall amrex::MFIter::grownnodaltilebox(MFIter *this,int dir,IntVect *a_ng)

{
  int in_EDX;
  IntVect *in_RSI;
  Box *in_RDI;
  IntVect *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  IntVect *local_2c;
  int local_24;
  int local_20 [2];
  int local_18;
  IntVect local_c;
  
  if (in_EDX < 0) {
    IntVect::IntVect((IntVect *)&local_2c,1);
    tilebox((MFIter *)CONCAT44(in_stack_ffffffffffffffcc,local_24),local_2c,in_RSI);
  }
  else {
    if (in_EDX == 0) {
      IntVect::IntVect(&local_c,1,0,0);
    }
    else if (in_EDX == 1) {
      IntVect::IntVect(&local_c,0,1,0);
    }
    else {
      IntVect::IntVect(&local_c,0,0,1);
    }
    local_18 = local_c.vect[2];
    local_20[0] = local_c.vect[0];
    local_20[1] = local_c.vect[1];
    tilebox((MFIter *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
            in_stack_ffffffffffffffc0,in_RSI);
  }
  return in_RDI;
}

Assistant:

Box
MFIter::grownnodaltilebox (int dir, IntVect const& a_ng) const noexcept
{
    BL_ASSERT(dir < AMREX_SPACEDIM);
    if (dir < 0) return tilebox(IntVect::TheNodeVector(), a_ng);
    return tilebox(IntVect::TheDimensionVector(dir), a_ng);
}